

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

void __thiscall BanMan::Discourage(BanMan *this,CNetAddr *net_addr)

{
  char *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> in_stack_00000010;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  Mutex *in_stack_ffffffffffffff88;
  Span<const_unsigned_char> *this_00;
  undefined1 in_stack_ffffffffffffffab;
  int in_stack_ffffffffffffffac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pszName;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffc0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffc8;
  CNetAddr *in_stack_ffffffffffffffe8;
  CRollingBloomFilter *this_01;
  
  this_01 = *(CRollingBloomFilter **)(in_FS_OFFSET + 0x28);
  pszName = in_RDI;
  MaybeCheckNotHeld(in_stack_ffffffffffffff88);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(char *)pszName,in_RSI,
             in_stack_ffffffffffffffac,(bool)in_stack_ffffffffffffffab);
  this_00 = (Span<const_unsigned_char> *)(in_RDI + 8);
  CNetAddr::GetAddrBytes(in_stack_ffffffffffffffe8);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (this_00,in_RDI,in_stack_ffffffffffffff88);
  CRollingBloomFilter::insert(this_01,in_stack_00000010);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff88);
  if (*(CRollingBloomFilter **)(in_FS_OFFSET + 0x28) == this_01) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::Discourage(const CNetAddr& net_addr)
{
    LOCK(m_banned_mutex);
    m_discouraged.insert(net_addr.GetAddrBytes());
}